

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<double,_toml::error_info> *
toml::read_float<double>(string *str,source_location *src,bool is_hex)

{
  byte in_CL;
  source_location *in_RDX;
  source_location *in_RDI;
  double in_stack_00000068;
  source_location *in_stack_00000070;
  string *in_stack_00000078;
  source_location *in_stack_00000200;
  string *in_stack_00000208;
  source_location *in_stack_fffffffffffffeb0;
  source_location *this;
  source_location local_120 [2];
  byte local_19;
  
  local_19 = in_CL & 1;
  if (local_19 == 0) {
    this = local_120;
    source_location::source_location(in_RDI,in_RDX);
    read_dec_float<double>(in_stack_00000208,in_stack_00000200);
    source_location::~source_location(this);
  }
  else {
    source_location::source_location(in_RDI,in_RDX);
    read_hex_float(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    source_location::~source_location(in_stack_fffffffffffffeb0);
  }
  return (result<double,_toml::error_info> *)in_RDI;
}

Assistant:

result<T, error_info>
read_float(const std::string& str, const source_location src, const bool is_hex)
{
    if(is_hex)
    {
        return read_hex_float(str, src, T{});
    }
    else
    {
        return read_dec_float<T>(str, src);
    }
}